

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_db_status(sqlite3 *db,int op,int *pCurrent,int *pHighwater,int resetFlag)

{
  ushort uVar1;
  Pager *pPVar2;
  Schema *pSVar3;
  Vdbe *p;
  long lVar4;
  void *pvVar5;
  sqlite3_pcache *psVar6;
  int iVar7;
  uint uVar8;
  Btree **ppBVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  HashElem *pHVar13;
  long lVar14;
  int nByte;
  int nByte_1;
  int local_50;
  int local_4c;
  int *local_48;
  int *local_40;
  ulong local_38;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  switch(op) {
  case 0:
    *pCurrent = (db->lookaside).nOut;
    *pHighwater = (db->lookaside).mxOut;
    iVar7 = 0;
    if (resetFlag != 0) {
      (db->lookaside).mxOut = (db->lookaside).nOut;
    }
    break;
  case 1:
    local_48 = pCurrent;
    local_40 = pHighwater;
    sqlite3BtreeEnterAll(db);
    iVar7 = db->nDb;
    iVar12 = 0;
    if (0 < iVar7) {
      lVar10 = 0;
      lVar14 = 8;
      iVar12 = 0;
      do {
        lVar4 = *(long *)((long)&db->aDb->zName + lVar14);
        if (lVar4 != 0) {
          pvVar5 = (void *)**(undefined8 **)(lVar4 + 8);
          uVar8 = *(uint *)((long)pvVar5 + 0xbc);
          uVar1 = *(ushort *)((long)pvVar5 + 0xb0);
          psVar6 = *(sqlite3_pcache **)(*(long *)((long)pvVar5 + 0x110) + 0x40);
          if (psVar6 == (sqlite3_pcache *)0x0) {
            iVar7 = 0;
          }
          else {
            local_38 = (ulong)uVar8;
            iVar7 = (*sqlite3Config.pcache2.xPagecount)(psVar6);
            uVar8 = (uint)local_38;
          }
          iVar11 = (*sqlite3Config.m.xSize)(pvVar5);
          iVar12 = iVar12 + iVar11 + (uVar1 + uVar8 + 0x70) * iVar7 + *(int *)((long)pvVar5 + 0xbc);
          iVar7 = db->nDb;
        }
        lVar10 = lVar10 + 1;
        lVar14 = lVar14 + 0x20;
      } while (lVar10 < iVar7);
    }
    sqlite3BtreeLeaveAll(db);
    *local_48 = iVar12;
    *local_40 = 0;
    goto LAB_0011a564;
  case 2:
    local_50 = 0;
    sqlite3BtreeEnterAll(db);
    db->pnBytesFreed = &local_50;
    if (0 < db->nDb) {
      lVar10 = 0;
      do {
        pSVar3 = db->aDb[lVar10].pSchema;
        if (pSVar3 != (Schema *)0x0) {
          iVar7 = (*sqlite3Config.m.xRoundup)(0x28);
          local_50 = local_50 +
                     ((pSVar3->trigHash).count + (pSVar3->tblHash).count + (pSVar3->idxHash).count +
                     (pSVar3->fkeyHash).count) * iVar7;
          iVar7 = (*sqlite3Config.m.xSize)((pSVar3->tblHash).ht);
          local_50 = local_50 + iVar7;
          iVar7 = (*sqlite3Config.m.xSize)((pSVar3->trigHash).ht);
          local_50 = local_50 + iVar7;
          iVar7 = (*sqlite3Config.m.xSize)((pSVar3->idxHash).ht);
          local_50 = local_50 + iVar7;
          iVar7 = (*sqlite3Config.m.xSize)((pSVar3->fkeyHash).ht);
          local_50 = local_50 + iVar7;
          for (pHVar13 = (pSVar3->trigHash).first; pHVar13 != (HashElem *)0x0;
              pHVar13 = pHVar13->next) {
            sqlite3DeleteTrigger(db,(Trigger *)pHVar13->data);
          }
          for (pHVar13 = (pSVar3->tblHash).first; pHVar13 != (HashElem *)0x0;
              pHVar13 = pHVar13->next) {
            sqlite3DeleteTable(db,(Table *)pHVar13->data);
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < db->nDb);
    }
    db->pnBytesFreed = (int *)0x0;
    sqlite3BtreeLeaveAll(db);
    *pHighwater = 0;
    *pCurrent = local_50;
LAB_0011a564:
    iVar7 = 0;
    break;
  case 3:
    local_4c = 0;
    db->pnBytesFreed = &local_4c;
    for (p = db->pVdbe; p != (Vdbe *)0x0; p = p->pNext) {
      sqlite3VdbeClearObject(db,p);
      sqlite3DbFree(db,p);
    }
    iVar7 = 0;
    db->pnBytesFreed = (int *)0x0;
    *pHighwater = 0;
    *pCurrent = local_4c;
    break;
  case 4:
  case 5:
  case 6:
    *pCurrent = 0;
    *pHighwater = (db->lookaside).anStat[op - 4U];
    iVar7 = 0;
    if (resetFlag != 0) {
      (db->lookaside).anStat[op - 4U] = 0;
    }
    break;
  case 7:
  case 8:
  case 9:
    iVar12 = db->nDb;
    iVar7 = 0;
    iVar11 = 0;
    if (0 < iVar12) {
      ppBVar9 = &db->aDb->pBt;
      lVar10 = 0;
      iVar11 = 0;
      do {
        if (*ppBVar9 != (Btree *)0x0) {
          pPVar2 = (*ppBVar9)->pBt->pPager;
          iVar11 = iVar11 + pPVar2->aStat[op - 7U];
          if (resetFlag != 0) {
            pPVar2->aStat[op - 7U] = 0;
            iVar12 = db->nDb;
          }
        }
        lVar10 = lVar10 + 1;
        ppBVar9 = ppBVar9 + 4;
      } while (lVar10 < iVar12);
    }
    *pHighwater = 0;
    *pCurrent = iVar11;
    break;
  default:
    iVar7 = 1;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar7;
}

Assistant:

SQLITE_API int sqlite3_db_status(
  sqlite3 *db,          /* The database connection whose status is desired */
  int op,               /* Status verb */
  int *pCurrent,        /* Write current value here */
  int *pHighwater,      /* Write high-water mark here */
  int resetFlag         /* Reset high-water mark if true */
){
  int rc = SQLITE_OK;   /* Return code */
  sqlite3_mutex_enter(db->mutex);
  switch( op ){
    case SQLITE_DBSTATUS_LOOKASIDE_USED: {
      *pCurrent = db->lookaside.nOut;
      *pHighwater = db->lookaside.mxOut;
      if( resetFlag ){
        db->lookaside.mxOut = db->lookaside.nOut;
      }
      break;
    }

    case SQLITE_DBSTATUS_LOOKASIDE_HIT:
    case SQLITE_DBSTATUS_LOOKASIDE_MISS_SIZE:
    case SQLITE_DBSTATUS_LOOKASIDE_MISS_FULL: {
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_HIT );
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_MISS_SIZE );
      testcase( op==SQLITE_DBSTATUS_LOOKASIDE_MISS_FULL );
      assert( (op-SQLITE_DBSTATUS_LOOKASIDE_HIT)>=0 );
      assert( (op-SQLITE_DBSTATUS_LOOKASIDE_HIT)<3 );
      *pCurrent = 0;
      *pHighwater = db->lookaside.anStat[op - SQLITE_DBSTATUS_LOOKASIDE_HIT];
      if( resetFlag ){
        db->lookaside.anStat[op - SQLITE_DBSTATUS_LOOKASIDE_HIT] = 0;
      }
      break;
    }

    /* 
    ** Return an approximation for the amount of memory currently used
    ** by all pagers associated with the given database connection.  The
    ** highwater mark is meaningless and is returned as zero.
    */
    case SQLITE_DBSTATUS_CACHE_USED: {
      int totalUsed = 0;
      int i;
      sqlite3BtreeEnterAll(db);
      for(i=0; i<db->nDb; i++){
        Btree *pBt = db->aDb[i].pBt;
        if( pBt ){
          Pager *pPager = sqlite3BtreePager(pBt);
          totalUsed += sqlite3PagerMemUsed(pPager);
        }
      }
      sqlite3BtreeLeaveAll(db);
      *pCurrent = totalUsed;
      *pHighwater = 0;
      break;
    }

    /*
    ** *pCurrent gets an accurate estimate of the amount of memory used
    ** to store the schema for all databases (main, temp, and any ATTACHed
    ** databases.  *pHighwater is set to zero.
    */
    case SQLITE_DBSTATUS_SCHEMA_USED: {
      int i;                      /* Used to iterate through schemas */
      int nByte = 0;              /* Used to accumulate return value */

      sqlite3BtreeEnterAll(db);
      db->pnBytesFreed = &nByte;
      for(i=0; i<db->nDb; i++){
        Schema *pSchema = db->aDb[i].pSchema;
        if( ALWAYS(pSchema!=0) ){
          HashElem *p;

          nByte += sqlite3GlobalConfig.m.xRoundup(sizeof(HashElem)) * (
              pSchema->tblHash.count 
            + pSchema->trigHash.count
            + pSchema->idxHash.count
            + pSchema->fkeyHash.count
          );
          nByte += sqlite3MallocSize(pSchema->tblHash.ht);
          nByte += sqlite3MallocSize(pSchema->trigHash.ht);
          nByte += sqlite3MallocSize(pSchema->idxHash.ht);
          nByte += sqlite3MallocSize(pSchema->fkeyHash.ht);

          for(p=sqliteHashFirst(&pSchema->trigHash); p; p=sqliteHashNext(p)){
            sqlite3DeleteTrigger(db, (Trigger*)sqliteHashData(p));
          }
          for(p=sqliteHashFirst(&pSchema->tblHash); p; p=sqliteHashNext(p)){
            sqlite3DeleteTable(db, (Table *)sqliteHashData(p));
          }
        }
      }
      db->pnBytesFreed = 0;
      sqlite3BtreeLeaveAll(db);

      *pHighwater = 0;
      *pCurrent = nByte;
      break;
    }

    /*
    ** *pCurrent gets an accurate estimate of the amount of memory used
    ** to store all prepared statements.
    ** *pHighwater is set to zero.
    */
    case SQLITE_DBSTATUS_STMT_USED: {
      struct Vdbe *pVdbe;         /* Used to iterate through VMs */
      int nByte = 0;              /* Used to accumulate return value */

      db->pnBytesFreed = &nByte;
      for(pVdbe=db->pVdbe; pVdbe; pVdbe=pVdbe->pNext){
        sqlite3VdbeClearObject(db, pVdbe);
        sqlite3DbFree(db, pVdbe);
      }
      db->pnBytesFreed = 0;

      *pHighwater = 0;
      *pCurrent = nByte;

      break;
    }

    /*
    ** Set *pCurrent to the total cache hits or misses encountered by all
    ** pagers the database handle is connected to. *pHighwater is always set 
    ** to zero.
    */
    case SQLITE_DBSTATUS_CACHE_HIT:
    case SQLITE_DBSTATUS_CACHE_MISS:
    case SQLITE_DBSTATUS_CACHE_WRITE:{
      int i;
      int nRet = 0;
      assert( SQLITE_DBSTATUS_CACHE_MISS==SQLITE_DBSTATUS_CACHE_HIT+1 );
      assert( SQLITE_DBSTATUS_CACHE_WRITE==SQLITE_DBSTATUS_CACHE_HIT+2 );

      for(i=0; i<db->nDb; i++){
        if( db->aDb[i].pBt ){
          Pager *pPager = sqlite3BtreePager(db->aDb[i].pBt);
          sqlite3PagerCacheStat(pPager, op, resetFlag, &nRet);
        }
      }
      *pHighwater = 0;
      *pCurrent = nRet;
      break;
    }

    default: {
      rc = SQLITE_ERROR;
    }
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}